

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O1

void __thiscall
HashtableAllTest_ResizeActuallyResizes_Test<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_ResizeActuallyResizes_Test<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *psVar1;
  uint uVar2;
  iterator iVar3;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  pointer piVar8;
  float fVar9;
  size_type kSize;
  AssertionResult gtest_ar_2;
  pair<google::sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
  r;
  Hasher local_148;
  Hasher local_138;
  SetKey<int,_Negation<int>_> local_12a;
  Negation<int> local_129;
  unsigned_long local_128;
  pair<google::sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
  local_120;
  undefined1 local_d0 [24];
  iterator local_b8;
  nonempty_iterator local_b0;
  iterator local_a8;
  undefined1 local_a0;
  undefined1 local_9e;
  int local_8c;
  vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  local_80;
  AssertHelperData *local_48;
  
  local_128 = 0x400;
  *(undefined8 *)
   ((long)&(this->
           super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ).
           super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.
           super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4> + 0x20) =
       0x3f4ccccd;
  fVar9 = (float)*(size_type *)
                  ((long)&(this->
                          super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                          ).
                          super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                          .ht_.
                          super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                          .ht_.table.settings + 0x10) * 0.8;
  uVar7 = (ulong)fVar9;
  *(ulong *)((long)&(this->
                    super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    ).
                    super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    .ht_.
                    super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    .ht_.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4> + 0x10)
       = (long)(fVar9 - 9.223372e+18) & (long)uVar7 >> 0x3f | uVar7;
  *(size_type *)
   ((long)&(this->
           super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ).
           super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.
           super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4> + 0x18) = 0;
  *(bool *)((long)&(this->
                   super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   ).
                   super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.
                   super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4> + 0x28)
       = false;
  iVar5 = UniqueObjectHelper<int>(0x396);
  psVar1 = &(this->
            super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ).
            super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            .ht_.
            super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            .ht_;
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(psVar1);
  *(bool *)((long)&(this->
                   super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   ).
                   super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.
                   super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4> + 0x2a)
       = true;
  (this->
  super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ).
  super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.
  super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.key_info.delkey = -iVar5;
  iVar5 = 1;
  do {
    iVar6 = UniqueObjectHelper<int>(iVar5);
    local_120.first.ht =
         (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          *)CONCAT44(local_120.first.ht._4_4_,iVar6);
    google::
    sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::resize_delta(psVar1,1);
    google::
    sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::insert_noresize((pair<google::sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
                       *)local_d0,psVar1,(const_reference)&local_120);
    iVar5 = iVar5 + 1;
  } while (iVar5 != 0x334);
  local_120.first.ht =
       *(sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         **)((long)&(this->
                    super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    ).
                    super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    .ht_.
                    super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    .ht_.table.settings + 0x10);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_d0,"kSize","this->ht_.bucket_count()",&local_128,
             (unsigned_long *)&local_120);
  if (local_d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_120);
    if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        local_d0._8_8_ ==
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      piVar8 = (pointer)0xafc493;
    }
    else {
      piVar8 = *(pointer *)local_d0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x5ac,(char *)piVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_148,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_148);
    if (local_120.first.ht !=
        (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_120.first.ht)->settings).
                             super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher
                  + 8))();
    }
  }
  uVar4 = local_d0._8_8_;
  if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      local_d0._8_8_ !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)*(pointer *)local_d0._8_8_ !=
        &(((Settings *)(local_d0._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_d0._8_8_);
    }
    operator_delete((void *)uVar4);
  }
  uVar2 = *(uint *)((long)&(this->
                           super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           ).
                           super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           .ht_.
                           super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           .ht_.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>
                   + 0x2c);
  iVar5 = 0x400;
  do {
    iVar6 = UniqueObjectHelper<int>(0x332);
    local_d0._0_4_ = -iVar6;
    google::
    sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::erase(psVar1,(key_type *)local_d0);
    iVar6 = UniqueObjectHelper<int>(0x332);
    local_120.first.ht =
         (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          *)CONCAT44(local_120.first.ht._4_4_,iVar6);
    google::
    sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::resize_delta(psVar1,1);
    google::
    sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::insert_noresize((pair<google::sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
                       *)local_d0,psVar1,(const_reference)&local_120);
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  local_120.first.ht =
       (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_120.first.ht._4_4_,
                   *(uint *)((long)&(this->
                                    super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                    ).
                                    super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                    .ht_.
                                    super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                    .ht_.settings.
                                    super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4> +
                            0x2c));
  local_148.id_ = uVar2 + 2;
  testing::internal::CmpHelperLT<int,int>
            ((internal *)local_d0,"this->ht_.num_table_copies()","pre_copies + 2",(int *)&local_120,
             &local_148.id_);
  if (local_d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_120);
    if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        local_d0._8_8_ ==
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      piVar8 = (pointer)0xafc493;
    }
    else {
      piVar8 = *(pointer *)local_d0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x5b5,(char *)piVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_148,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_148);
    if (local_120.first.ht !=
        (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_120.first.ht)->settings).
                             super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher
                  + 8))();
    }
  }
  if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      local_d0._8_8_ !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)*(pointer *)local_d0._8_8_ !=
        &(((Settings *)(local_d0._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_d0._8_8_);
    }
    operator_delete((void *)local_d0._8_8_);
  }
  local_148._0_8_ = (AssertHelperData *)0x0;
  local_148.num_compares_ = 0;
  local_138.id_ = 0;
  local_138.num_hashes_ = 0;
  local_138.num_compares_ = 0;
  local_120.first.ht =
       (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)((ulong)local_120.first.ht & 0xffffffff00000000);
  local_120.first.pos.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  psVar1 = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
            *)(local_d0 + 8);
  local_d0._0_8_ = &PTR__BaseHashtableInterface_00c231b8;
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable(psVar1,0,&local_148,&local_138,&local_129,&local_12a,
                     (Alloc<int,_unsigned_long,_18446744073709551615UL> *)&local_120);
  local_d0._0_8_ = &PTR__BaseHashtableInterface_00c23138;
  iVar5 = UniqueObjectHelper<int>(0x396);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(psVar1);
  local_8c = -iVar5;
  local_9e = 1;
  local_a8._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x3f4ccccd;
  uVar7 = (ulong)((float)local_48 * 0.8);
  local_b8._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       ((long)((float)local_48 * 0.8 - 9.223372e+18) & (long)uVar7 >> 0x3f | uVar7);
  local_b0 = (nonempty_iterator)0x0;
  local_a0 = 0;
  local_148._0_8_ = local_48;
  testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
            ((internal *)&local_120,"ht2.bucket_count()","kSize",(unsigned_long *)&local_148,
             &local_128);
  if ((char)local_120.first.ht == '\0') {
    testing::Message::Message((Message *)&local_148);
    if (local_120.first.pos.row_begin._M_current ==
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      piVar8 = (pointer)0xafc493;
    }
    else {
      piVar8 = (local_120.first.pos.row_begin._M_current)->group;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x5be,(char *)piVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_138,(Message *)&local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_138);
    if ((AssertHelperData *)local_148._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_148._0_8_ + 8))();
    }
  }
  iVar3._M_current = local_120.first.pos.row_begin._M_current;
  if (local_120.first.pos.row_begin._M_current !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)(local_120.first.pos.row_begin._M_current)->group !=
        &((local_120.first.pos.row_begin._M_current)->settings).
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>.
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete((local_120.first.pos.row_begin._M_current)->group);
    }
    operator_delete(iVar3._M_current);
  }
  iVar5 = 1;
  do {
    iVar6 = UniqueObjectHelper<int>(iVar5);
    local_148.id_ = iVar6;
    google::
    sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::resize_delta(psVar1,1);
    google::
    sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::insert_noresize(&local_120,psVar1,&local_148.id_);
    iVar5 = iVar5 + 1;
  } while (iVar5 != 0x334);
  local_148._0_8_ = local_48;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_120,"ht2.bucket_count()","kSize",(unsigned_long *)&local_148,
             &local_128);
  if ((char)local_120.first.ht == '\0') {
    testing::Message::Message((Message *)&local_148);
    if (local_120.first.pos.row_begin._M_current ==
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      piVar8 = (pointer)0xafc493;
    }
    else {
      piVar8 = (local_120.first.pos.row_begin._M_current)->group;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x5c2,(char *)piVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_138,(Message *)&local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_138);
    if ((AssertHelperData *)local_148._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_148._0_8_ + 8))();
    }
  }
  iVar3._M_current = local_120.first.pos.row_begin._M_current;
  if (local_120.first.pos.row_begin._M_current !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)(local_120.first.pos.row_begin._M_current)->group !=
        &((local_120.first.pos.row_begin._M_current)->settings).
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>.
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete((local_120.first.pos.row_begin._M_current)->group);
    }
    operator_delete(iVar3._M_current);
  }
  iVar5 = 1;
  do {
    iVar6 = UniqueObjectHelper<int>(iVar5);
    local_120.first.ht =
         (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          *)CONCAT44(local_120.first.ht._4_4_,-iVar6);
    google::
    sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::erase(psVar1,(key_type *)&local_120);
    local_148._0_8_ = local_48;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&local_120,"ht2.bucket_count()","kSize",(unsigned_long *)&local_148,
               &local_128);
    if ((char)local_120.first.ht == '\0') {
      testing::Message::Message((Message *)&local_148);
      piVar8 = (pointer)0xafc493;
      if (local_120.first.pos.row_begin._M_current !=
          (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           *)0x0) {
        piVar8 = (local_120.first.pos.row_begin._M_current)->group;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x5c5,(char *)piVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_138,(Message *)&local_148);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_138);
      if ((AssertHelperData *)local_148._0_8_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_148._0_8_ + 8))();
      }
    }
    iVar3._M_current = local_120.first.pos.row_begin._M_current;
    if (local_120.first.pos.row_begin._M_current !=
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      if ((int **)(local_120.first.pos.row_begin._M_current)->group !=
          &((local_120.first.pos.row_begin._M_current)->settings).
           super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>.
           super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
        operator_delete((local_120.first.pos.row_begin._M_current)->group);
      }
      operator_delete(iVar3._M_current);
    }
    iVar5 = iVar5 + 1;
  } while (iVar5 != 0x334);
  iVar5 = UniqueObjectHelper<int>(0x334);
  local_148.id_ = iVar5;
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(psVar1,1);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize(&local_120,psVar1,&local_148.id_);
  local_148._0_8_ = local_48;
  testing::internal::CmpHelperGE<unsigned_long,unsigned_long>
            ((internal *)&local_120,"ht2.bucket_count()","kSize",(unsigned_long *)&local_148,
             &local_128);
  if ((char)local_120.first.ht == '\0') {
    testing::Message::Message((Message *)&local_148);
    if (local_120.first.pos.row_begin._M_current ==
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      piVar8 = (pointer)0xafc493;
    }
    else {
      piVar8 = (local_120.first.pos.row_begin._M_current)->group;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x5c8,(char *)piVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_138,(Message *)&local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_138);
    if ((AssertHelperData *)local_148._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_148._0_8_ + 8))();
    }
  }
  iVar3._M_current = local_120.first.pos.row_begin._M_current;
  if (local_120.first.pos.row_begin._M_current !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)(local_120.first.pos.row_begin._M_current)->group !=
        &((local_120.first.pos.row_begin._M_current)->settings).
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>.
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete((local_120.first.pos.row_begin._M_current)->group);
    }
    operator_delete(iVar3._M_current);
  }
  local_d0._0_8_ = &PTR__BaseHashtableInterface_00c231b8;
  std::
  vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector(&local_80);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, ResizeActuallyResizes) {
  // This tests for a problem we had where we could repeatedly "resize"
  // a hashtable to the same size it was before, on every insert.
  const typename TypeParam::size_type kSize = 1 << 10;  // Pick any power of 2
  const float kResize = 0.8f;  // anything between 0.5 and 1 is fine.
  const int kThreshold = static_cast<int>(kSize * kResize - 1);
  this->ht_.set_resizing_parameters(0, kResize);
  this->ht_.set_deleted_key(this->UniqueKey(kThreshold + 100));

  // Get right up to the resizing threshold.
  for (int i = 0; i <= kThreshold; i++) {
    this->ht_.insert(this->UniqueObject(i + 1));
  }
  // The bucket count should equal kSize.
  EXPECT_EQ(kSize, this->ht_.bucket_count());

  // Now start doing erase+insert pairs.  This should cause us to
  // copy the hashtable at most once.
  const int pre_copies = this->ht_.num_table_copies();
  for (int i = 0; i < static_cast<int>(kSize); i++) {
    this->ht_.erase(this->UniqueKey(kThreshold));
    this->ht_.insert(this->UniqueObject(kThreshold));
  }
  EXPECT_LT(this->ht_.num_table_copies(), pre_copies + 2);

  // Now create a hashtable where we go right to the threshold, then
  // delete everything and do one insert.  Even though our hashtable
  // is now tiny, we should still have at least kSize buckets, because
  // our shrink threshhold is 0.
  TypeParam ht2;
  ht2.set_deleted_key(this->UniqueKey(kThreshold + 100));
  ht2.set_resizing_parameters(0, kResize);
  EXPECT_LT(ht2.bucket_count(), kSize);
  for (int i = 0; i <= kThreshold; i++) {
    ht2.insert(this->UniqueObject(i + 1));
  }
  EXPECT_EQ(ht2.bucket_count(), kSize);
  for (int i = 0; i <= kThreshold; i++) {
    ht2.erase(this->UniqueKey(i + 1));
    EXPECT_EQ(ht2.bucket_count(), kSize);
  }
  ht2.insert(this->UniqueObject(kThreshold + 2));
  EXPECT_GE(ht2.bucket_count(), kSize);
}